

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

int getPixelInterpolated(gdImagePtr im,double x,double y,int bgColor)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double kernel_y [4];
  double kernel_x [12];
  uint local_114;
  double adStack_b8 [4];
  double local_98 [13];
  
  if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
    return -1;
  }
  iVar9 = (int)x;
  iVar10 = (int)y;
  if (im->interpolation_id != GD_WEIGHTED4) {
    if (im->interpolation == (interpolation_method)0x0) {
      return -1;
    }
    iVar2 = iVar9 + -1;
    iVar6 = iVar10 + -1;
    lVar12 = 0;
    do {
      dVar16 = (*im->interpolation)((double)(iVar2 + (int)lVar12) - x);
      local_98[lVar12] = dVar16;
      dVar16 = (*im->interpolation)((double)(iVar6 + (int)lVar12) - y);
      adStack_b8[lVar12] = dVar16;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    uVar8 = 0x7f000000;
    if (bgColor != -1) {
      uVar8 = bgColor;
    }
    dVar16 = 0.0;
    dVar18 = 0.0;
    dVar17 = 0.0;
    dVar21 = 0.0;
    lVar12 = (long)iVar6;
    do {
      dVar22 = adStack_b8[lVar12 - iVar6];
      if (im->trueColor == 0) {
        pdVar14 = local_98;
        lVar13 = (long)iVar2 + -1;
        iVar11 = iVar2;
        do {
          iVar3 = gdImageBoundsSafe(im,iVar11,(int)lVar12);
          uVar7 = bgColor;
          if ((iVar3 != 0) &&
             (bVar1 = im->pixels[lVar12][lVar13 + 1], uVar7 = uVar8, im->transparent != (uint)bVar1)
             ) {
            uVar7 = im->green[bVar1] * 0x100 +
                    im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 + im->blue[bVar1];
          }
          dVar19 = *pdVar14 * dVar22;
          dVar21 = dVar21 + (double)(uVar7 >> 0x10 & 0xff) * dVar19;
          dVar17 = dVar17 + (double)(uVar7 >> 8 & 0xff) * dVar19;
          dVar18 = dVar18 + (double)(uVar7 & 0xff) * dVar19;
          dVar16 = dVar16 + (double)(uVar7 >> 0x18 & 0x7f) * dVar19;
          lVar13 = lVar13 + 1;
          pdVar14 = pdVar14 + 1;
          iVar11 = iVar11 + 1;
        } while (lVar13 < iVar9 + 2);
      }
      else {
        pdVar14 = local_98;
        lVar13 = (long)iVar2 + -1;
        iVar11 = iVar2;
        do {
          iVar3 = gdImageBoundsSafe(im,iVar11,(int)lVar12);
          uVar7 = bgColor;
          if ((iVar3 != 0) && (uVar7 = uVar8, im->tpixels[lVar12][lVar13 + 1] != im->transparent)) {
            uVar7 = im->tpixels[lVar12][lVar13 + 1];
          }
          dVar19 = *pdVar14 * dVar22;
          dVar21 = dVar21 + (double)(uVar7 >> 0x10 & 0xff) * dVar19;
          dVar17 = dVar17 + (double)(uVar7 >> 8 & 0xff) * dVar19;
          dVar18 = dVar18 + (double)(uVar7 & 0xff) * dVar19;
          dVar16 = dVar16 + (double)(uVar7 >> 0x18 & 0x7f) * dVar19;
          lVar13 = lVar13 + 1;
          pdVar14 = pdVar14 + 1;
          iVar11 = iVar11 + 1;
        } while (lVar13 < iVar9 + 2);
      }
      bVar15 = lVar12 < iVar10 + 2;
      lVar12 = lVar12 + 1;
    } while (bVar15);
    iVar9 = 0xff0000;
    if (dVar21 <= 255.0) {
      dVar22 = 0.0;
      if (0.0 <= dVar21) {
        dVar22 = dVar21;
      }
      iVar9 = (int)dVar22 << 0x10;
    }
    iVar10 = 0xff00;
    if (dVar17 <= 255.0) {
      dVar21 = 0.0;
      if (0.0 <= dVar17) {
        dVar21 = dVar17;
      }
      iVar10 = (int)dVar21 << 8;
    }
    iVar6 = 0xff;
    if (dVar18 <= 255.0) {
      dVar17 = 0.0;
      if (0.0 <= dVar18) {
        dVar17 = dVar18;
      }
      iVar6 = (int)dVar17;
    }
    iVar2 = 0x7f000000;
    if (dVar16 <= 127.0) {
      dVar18 = 0.0;
      if (0.0 <= dVar16) {
        dVar18 = dVar16;
      }
      iVar2 = (int)dVar18 << 0x18;
    }
    return iVar10 + iVar9 + iVar6 + iVar2;
  }
  iVar6 = im->trueColor;
  iVar2 = gdImageBoundsSafe(im,iVar9,iVar10);
  lVar12 = (long)iVar9;
  uVar8 = bgColor;
  if (iVar6 == 1) {
    if (iVar2 != 0) {
      uVar8 = 0x7f000000;
      if (bgColor != -1) {
        uVar8 = bgColor;
      }
      bVar15 = im->tpixels[iVar10][lVar12] == im->transparent;
      uVar7 = im->tpixels[iVar10][lVar12];
LAB_001190e3:
      if (!bVar15) {
        uVar8 = uVar7;
      }
    }
  }
  else if (iVar2 != 0) {
    bVar1 = im->pixels[iVar10][lVar12];
    if (im->transparent == (uint)bVar1) {
      bVar15 = bgColor == -1;
      uVar8 = 0x7f000000;
      uVar7 = bgColor;
      goto LAB_001190e3;
    }
    uVar8 = im->green[bVar1] * 0x100 + im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 +
            im->blue[bVar1];
  }
  iVar6 = im->trueColor;
  iVar11 = (int)(lVar12 + -1);
  iVar2 = gdImageBoundsSafe(im,iVar11,iVar10);
  uVar7 = bgColor;
  if (iVar6 == 1) {
    if (iVar2 != 0) {
      uVar7 = 0x7f000000;
      if (bgColor != -1) {
        uVar7 = bgColor;
      }
      bVar15 = im->tpixels[iVar10][iVar11] == im->transparent;
      uVar4 = im->tpixels[iVar10][iVar11];
LAB_001191ec:
      if (!bVar15) {
        uVar7 = uVar4;
      }
    }
  }
  else if (iVar2 != 0) {
    bVar1 = im->pixels[iVar10][lVar12 + -1];
    if (im->transparent == (uint)bVar1) {
      bVar15 = bgColor == -1;
      uVar7 = 0x7f000000;
      uVar4 = bgColor;
      goto LAB_001191ec;
    }
    uVar7 = im->green[bVar1] * 0x100 + im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 +
            im->blue[bVar1];
  }
  dVar16 = x - (double)iVar9;
  dVar18 = y - (double)iVar10;
  iVar6 = im->trueColor;
  iVar10 = iVar10 + -1;
  iVar2 = gdImageBoundsSafe(im,iVar9,iVar10);
  uVar4 = bgColor;
  if (iVar6 == 1) {
    if (iVar2 == 0) goto LAB_00119316;
    uVar4 = 0x7f000000;
    if (bgColor != -1) {
      uVar4 = bgColor;
    }
    bVar15 = im->tpixels[iVar10][lVar12] == im->transparent;
    uVar5 = im->tpixels[iVar10][lVar12];
  }
  else {
    if (iVar2 == 0) goto LAB_00119316;
    bVar1 = im->pixels[iVar10][lVar12];
    if (im->transparent != (uint)bVar1) {
      uVar4 = im->green[bVar1] * 0x100 + im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 +
              im->blue[bVar1];
      goto LAB_00119316;
    }
    bVar15 = bgColor == -1;
    uVar4 = 0x7f000000;
    uVar5 = bgColor;
  }
  if (!bVar15) {
    uVar4 = uVar5;
  }
LAB_00119316:
  if (im->trueColor == 1) {
    iVar6 = gdImageBoundsSafe(im,iVar9 + -1,iVar10);
    local_114 = bgColor;
    if (iVar6 != 0) {
      local_114 = 0x7f000000;
      if (bgColor != -1) {
        local_114 = bgColor;
      }
      if (im->tpixels[iVar10][iVar9 + -1] != im->transparent) {
        local_114 = im->tpixels[iVar10][iVar9 + -1];
      }
    }
  }
  else {
    iVar9 = gdImageBoundsSafe(im,iVar9,iVar10);
    local_114 = bgColor;
    if (iVar9 != 0) {
      bVar1 = im->pixels[iVar10][lVar12];
      if (im->transparent == (uint)bVar1) {
        local_114 = bgColor;
        if (bgColor == -1) {
          local_114 = 0x7f000000;
        }
      }
      else {
        local_114 = im->green[bVar1] * 0x100 +
                    im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 + im->blue[bVar1];
      }
    }
  }
  dVar17 = dVar16 * dVar18;
  dVar22 = dVar18 * (1.0 - dVar16);
  dVar21 = dVar16 * (1.0 - dVar18);
  dVar16 = (1.0 - dVar16) * (1.0 - dVar18);
  if (im->trueColor == 0) {
    lVar12 = (long)(int)local_114;
    dVar18 = (double)im->red[lVar12] * dVar16 +
             (double)im->red[(int)uVar4] * dVar21 +
             (double)im->red[(int)uVar8] * dVar17 + (double)im->red[(int)uVar7] * dVar22;
    dVar19 = (double)im->green[lVar12] * dVar16 +
             (double)im->green[(int)uVar4] * dVar21 +
             (double)im->green[(int)uVar8] * dVar17 + (double)im->green[(int)uVar7] * dVar22;
    dVar20 = (double)im->blue[lVar12] * dVar16 +
             (double)im->blue[(int)uVar4] * dVar21 +
             (double)im->blue[(int)uVar8] * dVar17 + (double)im->blue[(int)uVar7] * dVar22;
    dVar17 = (double)im->alpha[(int)uVar4] * dVar21 +
             (double)im->alpha[(int)uVar8] * dVar17 + (double)im->alpha[(int)uVar7] * dVar22;
    uVar8 = im->alpha[lVar12];
  }
  else {
    dVar18 = (double)(local_114 >> 0x10 & 0xff) * dVar16 +
             (double)(uVar4 >> 0x10 & 0xff) * dVar21 +
             (double)(uVar8 >> 0x10 & 0xff) * dVar17 + (double)(uVar7 >> 0x10 & 0xff) * dVar22;
    dVar19 = (double)(local_114 >> 8 & 0xff) * dVar16 +
             (double)(uVar4 >> 8 & 0xff) * dVar21 +
             (double)(uVar8 >> 8 & 0xff) * dVar17 + (double)(uVar7 >> 8 & 0xff) * dVar22;
    dVar20 = (double)(local_114 & 0xff) * dVar16 +
             (double)(uVar4 & 0xff) * dVar21 +
             (double)(uVar8 & 0xff) * dVar17 + (double)(uVar7 & 0xff) * dVar22;
    dVar17 = (double)(uVar4 >> 0x18 & 0x7f) * dVar21 +
             (double)(uVar8 >> 0x18 & 0x7f) * dVar17 + (double)(uVar7 >> 0x18 & 0x7f) * dVar22;
    uVar8 = local_114 >> 0x18 & 0x7f;
  }
  iVar6 = (int)((double)(int)uVar8 * dVar16 + dVar17);
  uVar8 = (uint)dVar20;
  iVar9 = (int)dVar19;
  iVar10 = (int)dVar18;
  if ((int)dVar18 < 1) {
    iVar10 = 0;
  }
  if (0xfe < iVar10) {
    iVar10 = 0xff;
  }
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  if (0xfe < (int)uVar8) {
    uVar8 = 0xff;
  }
  iVar2 = 0;
  if (0 < iVar6) {
    iVar2 = iVar6;
  }
  iVar6 = 0x7f;
  if (iVar2 < 0x7f) {
    iVar6 = iVar2;
  }
  return iVar9 << 8 | uVar8 | iVar10 << 0x10 | iVar6 << 0x18;
}

Assistant:

int getPixelInterpolated(gdImagePtr im, const double x, const double y, const int bgColor)
{
	const int xi=(int)(x);
	const int yi=(int)(y);
	int yii;
	int i;
	double kernel, kernel_cache_y;
	double kernel_x[12], kernel_y[4];
	double new_r = 0.0f, new_g = 0.0f, new_b = 0.0f, new_a = 0.0f;

	/* These methods use special implementations */
	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		return -1;
	}

	if (im->interpolation_id == GD_WEIGHTED4) {
		return getPixelInterpolateWeight(im, x, y, bgColor);
	}

	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		if (im->trueColor == 1) {
			return getPixelOverflowTC(im, xi, yi, bgColor);
		} else {
			return getPixelOverflowPalette(im, xi, yi, bgColor);
		}
	}
	if (im->interpolation) {
		for (i=0; i<4; i++) {
			kernel_x[i] = (double) im->interpolation((double)(xi+i-1-x));
			kernel_y[i] = (double) im->interpolation((double)(yi+i-1-y));
		}
	} else {
		return -1;
	}

	/*
	 * TODO: use the known fast rgba multiplication implementation once
	 * the new formats are in place
	 */
	for (yii = yi-1; yii < yi+3; yii++) {
		int xii;
		kernel_cache_y = kernel_y[yii-(yi-1)];
		if (im->trueColor) {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowTC(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		} else {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowPalette(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		}
	}

	new_r = CLAMP(new_r, 0, 255);
	new_g = CLAMP(new_g, 0, 255);
	new_b = CLAMP(new_b, 0, 255);
	new_a = CLAMP(new_a, 0, gdAlphaMax);

	return gdTrueColorAlpha(((int)new_r), ((int)new_g), ((int)new_b), ((int)new_a));
}